

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int *in_RSI;
  char **in_stack_ffffffffffffffe8;
  
  testing::InitGoogleMock(in_RSI,in_stack_ffffffffffffffe8);
  iVar1 = RUN_ALL_TESTS();
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
#ifdef _WIN32
  // Disable message boxes on assertion failures.
  _CrtSetReportMode(_CRT_ERROR, _CRTDBG_MODE_FILE | _CRTDBG_MODE_DEBUG);
  _CrtSetReportFile(_CRT_ERROR, _CRTDBG_FILE_STDERR);
  _CrtSetReportMode(_CRT_ASSERT, _CRTDBG_MODE_FILE | _CRTDBG_MODE_DEBUG);
  _CrtSetReportFile(_CRT_ASSERT, _CRTDBG_FILE_STDERR);
#endif
  testing::InitGoogleMock(&argc, argv);
  return RUN_ALL_TESTS();
}